

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dungeon.c
# Opt level: O2

void restore_dungeon(memfile *mf)

{
  int8_t iVar1;
  d_flags dVar2;
  int32_t iVar3;
  uint uVar4;
  branch *pbVar5;
  branch *pbVar6;
  long lVar7;
  branch **ppbVar8;
  dungeon *buf;
  
  mfmagic_check(mf,0x4e4744);
  mread(mf,&n_dgns,4);
  buf = dungeons;
  for (lVar7 = 0; lVar7 < n_dgns; lVar7 = lVar7 + 1) {
    mread(mf,buf,0x18);
    mread(mf,buf->proto,0xf);
    iVar1 = mread8(mf);
    buf->boneid = iVar1;
    dVar2 = restore_d_flags(mf);
    buf->flags = dVar2;
    iVar1 = mread8(mf);
    buf->entry_lev = iVar1;
    iVar1 = mread8(mf);
    buf->num_dunlevs = iVar1;
    iVar1 = mread8(mf);
    buf->dunlev_ureached = iVar1;
    iVar3 = mread32(mf);
    buf->ledger_start = iVar3;
    iVar3 = mread32(mf);
    buf->depth_start = iVar3;
    buf = buf + 1;
  }
  mread(mf,&dungeon_topology,0x3e);
  mread(mf,tune,6);
  branches = (branch *)0x0;
  uVar4 = mread32(mf);
  ppbVar8 = (branch **)0x0;
  pbVar6 = (branch *)(ulong)uVar4;
  if ((int)uVar4 < 1) {
    pbVar6 = (branch *)ppbVar8;
  }
  while ((int)pbVar6 != 0) {
    pbVar5 = (branch *)malloc(0x18);
    pbVar5->next = (branch *)0x0;
    iVar3 = mread32(mf);
    pbVar5->id = iVar3;
    iVar3 = mread32(mf);
    pbVar5->type = iVar3;
    mread(mf,&pbVar5->end1,2);
    mread(mf,&pbVar5->end2,2);
    iVar1 = mread8(mf);
    pbVar5->end1_up = iVar1;
    if ((branch *)ppbVar8 == (branch *)0x0) {
      ppbVar8 = &branches;
    }
    ((branch *)ppbVar8)->next = pbVar5;
    pbVar6 = (branch *)(ulong)((int)pbVar6 - 1);
    ppbVar8 = (branch **)pbVar5;
  }
  mread(mf,&inv_pos,2);
  return;
}

Assistant:

void restore_dungeon(struct memfile *mf)
{
    branch *curr, *last;
    int    count, i;

    mfmagic_check(mf, DGN_MAGIC);
    mread(mf, &n_dgns, sizeof(n_dgns));
    for (i = 0; i < n_dgns; i++)
	restore_dungeon_struct(mf, &dungeons[i]);
    mread(mf, &dungeon_topology, sizeof dungeon_topology);
    mread(mf, tune, sizeof tune);

    last = branches = NULL;

    count = mread32(mf);
    for (i = 0; i < count; i++) {
	curr = malloc(sizeof(branch));
	restore_branch(mf, curr);
	if (last)
	    last->next = curr;
	else
	    branches = curr;
	last = curr;
    }

    mread(mf, &inv_pos, sizeof(coord));
}